

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O2

void __thiscall AST::IntegerLit::IntegerLit(IntegerLit *this,string *value)

{
  longlong lVar1;
  
  (this->super_Expr).super_Stmt._vptr_Stmt = (_func_int **)&PTR__Stmt_0017fb08;
  lVar1 = std::__cxx11::stoll(value,(size_t *)0x0,10);
  this->m_value = lVar1;
  return;
}

Assistant:

explicit IntegerLit(const std::string &value) : m_value(std::stoll(value)) { }